

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cc
# Opt level: O0

bool __thiscall
google::protobuf::compiler::Parser::ValidateEnum(Parser *this,EnumDescriptorProto *proto)

{
  size_t *__return_storage_ptr__;
  bool bVar1;
  int iVar2;
  int iVar3;
  EnumOptions *pEVar4;
  UninterpretedOption *from;
  UninterpretedOption_NamePart *pUVar5;
  string *psVar6;
  RepeatedPtrField<google::protobuf::EnumValueDescriptorProto> *this_00;
  pair<std::_Rb_tree_const_iterator<int>,_bool> pVar7;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1c8;
  reference local_1a8;
  EnumValueDescriptorProto *enum_value_1;
  const_iterator __end3;
  const_iterator __begin3;
  RepeatedPtrField<google::protobuf::EnumValueDescriptorProto> *__range3;
  undefined1 local_168 [8];
  string error_1;
  int32_t local_134;
  _Self local_130;
  int32_t local_124;
  _Self local_120;
  EnumValueDescriptorProto *local_118;
  EnumValueDescriptorProto *enum_value;
  int i_1;
  bool has_duplicates;
  set<int,_std::less<int>,_std::allocator<int>_> used_values;
  undefined1 local_b8 [8];
  string error;
  undefined1 local_88 [8];
  UninterpretedOption option;
  int i;
  bool allow_alias;
  bool has_allow_alias;
  EnumDescriptorProto *proto_local;
  Parser *this_local;
  
  option.double_value_._7_1_ = 0;
  option.double_value_._6_1_ = 0;
  option.double_value_._0_4_ = 0;
  while( true ) {
    iVar3 = option.double_value_._0_4_;
    pEVar4 = EnumDescriptorProto::options(proto);
    iVar2 = EnumOptions::uninterpreted_option_size(pEVar4);
    if (iVar2 <= iVar3) break;
    pEVar4 = EnumDescriptorProto::options(proto);
    from = EnumOptions::uninterpreted_option(pEVar4,option.double_value_._0_4_);
    UninterpretedOption::UninterpretedOption((UninterpretedOption *)local_88,from);
    iVar3 = UninterpretedOption::name_size((UninterpretedOption *)local_88);
    if (iVar3 < 2) {
      pUVar5 = UninterpretedOption::name((UninterpretedOption *)local_88,0);
      bVar1 = UninterpretedOption_NamePart::is_extension(pUVar5);
      if (!bVar1) {
        pUVar5 = UninterpretedOption::name((UninterpretedOption *)local_88,0);
        psVar6 = UninterpretedOption_NamePart::name_part_abi_cxx11_(pUVar5);
        bVar1 = std::operator==(psVar6,"allow_alias");
        if (bVar1) {
          option.double_value_._7_1_ = 1;
          psVar6 = UninterpretedOption::identifier_value_abi_cxx11_((UninterpretedOption *)local_88)
          ;
          bVar1 = std::operator==(psVar6,"true");
          if (bVar1) {
            option.double_value_._6_1_ = 1;
          }
          error.field_2._8_4_ = 2;
          goto LAB_0063061b;
        }
      }
      error.field_2._8_4_ = 0;
    }
    else {
      error.field_2._8_4_ = 4;
    }
LAB_0063061b:
    UninterpretedOption::~UninterpretedOption((UninterpretedOption *)local_88);
    if ((error.field_2._8_4_ != 0) && (error.field_2._8_4_ == 2)) break;
    option.double_value_._0_4_ = option.double_value_._0_4_ + 1;
  }
  if (((option.double_value_._7_1_ & 1) == 0) || ((option.double_value_._6_1_ & 1) != 0)) {
    std::set<int,_std::less<int>,_std::allocator<int>_>::set
              ((set<int,_std::less<int>,_std::allocator<int>_> *)&i_1);
    enum_value._7_1_ = 0;
    for (enum_value._0_4_ = 0; iVar3 = (int)enum_value,
        iVar2 = EnumDescriptorProto::value_size(proto), iVar3 < iVar2;
        enum_value._0_4_ = (int)enum_value + 1) {
      local_118 = EnumDescriptorProto::value(proto,(int)enum_value);
      local_124 = EnumValueDescriptorProto::number(local_118);
      local_120._M_node =
           (_Base_ptr)
           std::set<int,_std::less<int>,_std::allocator<int>_>::find
                     ((set<int,_std::less<int>,_std::allocator<int>_> *)&i_1,&local_124);
      local_130._M_node =
           (_Base_ptr)
           std::set<int,_std::less<int>,_std::allocator<int>_>::end
                     ((set<int,_std::less<int>,_std::allocator<int>_> *)&i_1);
      bVar1 = std::operator!=(&local_120,&local_130);
      if (bVar1) {
        enum_value._7_1_ = 1;
        break;
      }
      local_134 = EnumValueDescriptorProto::number(local_118);
      pVar7 = std::set<int,_std::less<int>,_std::allocator<int>_>::insert
                        ((set<int,_std::less<int>,_std::allocator<int>_> *)&i_1,&local_134);
      error_1.field_2._8_8_ = pVar7.first._M_node;
    }
    if (((option.double_value_._6_1_ & 1) == 0) || ((enum_value._7_1_ & 1) != 0)) {
      if ((option.double_value_._6_1_ & 1) == 0) {
        this_00 = EnumDescriptorProto::value(proto);
        __end3 = RepeatedPtrField<google::protobuf::EnumValueDescriptorProto>::begin(this_00);
        enum_value_1 = (EnumValueDescriptorProto *)
                       RepeatedPtrField<google::protobuf::EnumValueDescriptorProto>::end(this_00);
        while (bVar1 = internal::
                       RepeatedPtrIterator<const_google::protobuf::EnumValueDescriptorProto>::
                       operator!=(&__end3,(iterator *)&enum_value_1), bVar1) {
          local_1a8 = internal::
                      RepeatedPtrIterator<const_google::protobuf::EnumValueDescriptorProto>::
                      operator*(&__end3);
          psVar6 = EnumValueDescriptorProto::name_abi_cxx11_(local_1a8);
          bVar1 = anon_unknown_0::IsUpperUnderscore(psVar6);
          if (!bVar1) {
            psVar6 = EnumValueDescriptorProto::name_abi_cxx11_(local_1a8);
            std::operator+(&local_1e8,"Enum constant should be in UPPER_CASE. Found: ",psVar6);
            std::operator+(&local_1c8,&local_1e8,
                           ". See https://developers.google.com/protocol-buffers/docs/style");
            AddWarning(this,&local_1c8);
            std::__cxx11::string::~string((string *)&local_1c8);
            std::__cxx11::string::~string((string *)&local_1e8);
          }
          internal::RepeatedPtrIterator<const_google::protobuf::EnumValueDescriptorProto>::
          operator++(&__end3);
        }
      }
      this_local._7_1_ = true;
      error.field_2._8_4_ = 1;
    }
    else {
      psVar6 = EnumDescriptorProto::name_abi_cxx11_(proto);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&__range3,
                     "\"",psVar6);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_168,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&__range3,
                     "\" declares support for enum aliases but no enum values share field numbers. Please remove the unnecessary \'option allow_alias = true;\' declaration."
                    );
      std::__cxx11::string::~string((string *)&__range3);
      AddError(this,(string *)local_168);
      this_local._7_1_ = false;
      error.field_2._8_4_ = 1;
      std::__cxx11::string::~string((string *)local_168);
    }
    std::set<int,_std::less<int>,_std::allocator<int>_>::~set
              ((set<int,_std::less<int>,_std::allocator<int>_> *)&i_1);
  }
  else {
    psVar6 = EnumDescriptorProto::name_abi_cxx11_(proto);
    __return_storage_ptr__ = &used_values._M_t._M_impl.super__Rb_tree_header._M_node_count;
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   __return_storage_ptr__,"\"",psVar6);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_b8,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   __return_storage_ptr__,
                   "\" declares \'option allow_alias = false;\' which has no effect. Please remove the declaration."
                  );
    std::__cxx11::string::~string
              ((string *)&used_values._M_t._M_impl.super__Rb_tree_header._M_node_count);
    AddError(this,(string *)local_b8);
    this_local._7_1_ = false;
    error.field_2._8_4_ = 1;
    std::__cxx11::string::~string((string *)local_b8);
  }
  return this_local._7_1_;
}

Assistant:

bool Parser::ValidateEnum(const EnumDescriptorProto* proto) {
  bool has_allow_alias = false;
  bool allow_alias = false;

  for (int i = 0; i < proto->options().uninterpreted_option_size(); i++) {
    const UninterpretedOption option = proto->options().uninterpreted_option(i);
    if (option.name_size() > 1) {
      continue;
    }
    if (!option.name(0).is_extension() &&
        option.name(0).name_part() == "allow_alias") {
      has_allow_alias = true;
      if (option.identifier_value() == "true") {
        allow_alias = true;
      }
      break;
    }
  }

  if (has_allow_alias && !allow_alias) {
    std::string error =
        "\"" + proto->name() +
        "\" declares 'option allow_alias = false;' which has no effect. "
        "Please remove the declaration.";
    // This needlessly clutters declarations with nops.
    AddError(error);
    return false;
  }

  std::set<int> used_values;
  bool has_duplicates = false;
  for (int i = 0; i < proto->value_size(); ++i) {
    const EnumValueDescriptorProto& enum_value = proto->value(i);
    if (used_values.find(enum_value.number()) != used_values.end()) {
      has_duplicates = true;
      break;
    } else {
      used_values.insert(enum_value.number());
    }
  }
  if (allow_alias && !has_duplicates) {
    std::string error =
        "\"" + proto->name() +
        "\" declares support for enum aliases but no enum values share field "
        "numbers. Please remove the unnecessary 'option allow_alias = true;' "
        "declaration.";
    // Generate an error if an enum declares support for duplicate enum values
    // and does not use it protect future authors.
    AddError(error);
    return false;
  }

  // Enforce that enum constants must be UPPER_CASE except in case of
  // enum_alias.
  if (!allow_alias) {
    for (const auto& enum_value : proto->value()) {
      if (!IsUpperUnderscore(enum_value.name())) {
        AddWarning(
            "Enum constant should be in UPPER_CASE. Found: " +
            enum_value.name() +
            ". See https://developers.google.com/protocol-buffers/docs/style");
      }
    }
  }

  return true;
}